

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  string *psVar1;
  pointer pcVar2;
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  _Var3;
  __uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
  _Var4;
  GeneratorFactory *pGVar5;
  string_view file_name;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  FileDescriptor *pFVar9;
  Nonnull<const_char_*> pcVar10;
  undefined8 extraout_RAX;
  long lVar11;
  long lVar13;
  long lVar14;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view begin_varname;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view end_varname;
  string_view java_class_name;
  string_view annotation_file;
  int method_num;
  unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
  generator;
  int static_block_bytecode_estimate;
  string local_100;
  AlphaNum local_e0;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined2 local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60 [3];
  char *pcVar12;
  
  psVar1 = this->file_->name_;
  local_60[0]._M_str = (psVar1->_M_dataplus)._M_p;
  local_60[0]._M_len = psVar1->_M_string_length;
  text._M_str = 
  "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// NO CHECKED-IN PROTOBUF GENCODE\n// source: $filename$\n"
  ;
  text._M_len = 0x74;
  io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text,(char (*) [9])"filename",local_60);
  if ((this->options_).opensource_runtime == true) {
    text_00._M_str = "// Protobuf Java Version: $protobuf_java_version$\n";
    text_00._M_len = 0x32;
    io::Printer::Print<char[22],char[11]>
              (printer,text_00,(char (*) [22])"protobuf_java_version",(char (*) [11])"4.31.0-dev");
  }
  text_01._M_str = "\n";
  text_01._M_len = 1;
  io::Printer::Print<>(printer,text_01);
  if ((this->java_package_)._M_string_length != 0) {
    text_02._M_str = "package $package$;\n\n";
    text_02._M_len = 0x14;
    io::Printer::Print<char[8],std::__cxx11::string>
              (printer,text_02,(char (*) [8])0x13f0bd3,&this->java_package_);
  }
  if ((this->options_).annotate_code == true) {
    local_60[0]._M_str = (this->classname_)._M_dataplus._M_p;
    local_60[0]._M_len = (this->classname_)._M_string_length;
    local_e0.piece_._M_len = (size_t)&DAT_0000000d;
    local_e0.piece_._M_str = ".java.pb.meta";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_100,(lts_20250127 *)local_60,&local_e0,(AlphaNum *)local_60[0]._M_len);
  }
  else {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,anon_var_dwarf_a12c75 + 5);
  }
  _Var6._M_p = local_100._M_dataplus._M_p;
  local_b0[0] = (this->options_).generate_immutable_code;
  local_b0[1] = (this->options_).generate_mutable_code;
  local_b0[2] = (this->options_).generate_shared_code;
  local_b0[3] = (this->options_).enforce_lite;
  local_b0[4] = (this->options_).opensource_runtime;
  local_b0[5] = (this->options_).annotate_code;
  pcVar2 = (this->options_).annotation_list_file._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,
             pcVar2 + (this->options_).annotation_list_file._M_string_length);
  pcVar2 = (this->options_).output_list_file._M_dataplus._M_p;
  local_88._M_p = (pointer)&local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + (this->options_).output_list_file._M_string_length)
  ;
  local_68._0_1_ = (this->options_).strip_nonfunctional_codegen;
  local_68._1_1_ = (this->options_).jvm_dsl;
  annotation_file._M_str = _Var6._M_p;
  annotation_file._M_len = local_100._M_string_length;
  PrintGeneratedAnnotation(printer,'$',annotation_file,(Options *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((this->options_).opensource_runtime == false) {
    text_03._M_str = "@com.google.protobuf.Internal.ProtoNonnullApi\n";
    text_03._M_len = 0x2e;
    io::Printer::Print<>(printer,text_03);
  }
  local_60[0]._M_len = (size_t)(anon_var_dwarf_a12c75 + 5);
  if ((this->file_->options_->field_0)._impl_.deprecated_ != false) {
    local_60[0]._M_len = 0x13710ef;
  }
  text_04._M_str = "$deprecation$public final class $classname$ {\n  private $ctor$() {}\n";
  text_04._M_len = 0x44;
  io::Printer::
  Print<char[12],char_const*,char[10],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,text_04,(char (*) [12])"deprecation",(char **)local_60,(char (*) [10])0x134d25a
             ,&this->classname_,(char (*) [5])0x1175254,&this->classname_);
  psVar1 = this->file_->name_;
  local_60[0]._M_str = (psVar1->_M_dataplus)._M_p;
  local_60[0]._M_len = psVar1->_M_string_length;
  file_name._M_str = local_60[0]._M_str;
  file_name._M_len = local_60[0]._M_len;
  begin_varname._M_str = "classname";
  begin_varname._M_len = 9;
  end_varname._M_str = "classname";
  end_varname._M_len = 9;
  pcVar12 = "classname";
  io::Printer::Annotate
            (printer,begin_varname,end_varname,file_name,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  if ((((this->context_)._M_t.
        super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
      options_).enforce_lite == false) {
    text_05._M_str = "static {\n";
    text_05._M_len = 9;
    io::Printer::Print<>(printer,text_05);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    java_class_name._M_str = pcVar12;
    java_class_name._M_len = (size_t)(this->classname_)._M_dataplus._M_p;
    PrintGencodeVersionValidator
              ((java *)printer,(Printer *)(ulong)(this->options_).opensource_runtime,
               SUB81((this->classname_)._M_string_length,0),java_class_name);
    io::Printer::Outdent(printer);
    text_06._M_str = "}\n";
    text_06._M_len = 2;
    io::Printer::Print<>(printer,text_06);
  }
  text_07._M_str =
       "public static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistryLite registry) {\n"
  ;
  text_07._M_len = 100;
  io::Printer::Print<>(printer,text_07);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  if (0 < this->file_->extension_count_) {
    lVar14 = 0;
    do {
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
      _M_head_impl = (this->extension_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                            ._M_head_impl + 0x20))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                 ._M_head_impl,printer);
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->file_->extension_count_);
  }
  if (0 < this->file_->message_type_count_) {
    lVar14 = 0;
    do {
      _Var4._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var4._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                            ._M_head_impl + 0x30))
                (_Var4._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                 ._M_head_impl,printer);
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->file_->message_type_count_);
  }
  io::Printer::Outdent(printer);
  text_08._M_str = "}\n";
  text_08._M_len = 2;
  io::Printer::Print<>(printer,text_08);
  if ((((this->context_)._M_t.
        super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
      options_).enforce_lite == false) {
    text_09._M_str =
         "\npublic static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistry registry) {\n  registerAllExtensions(\n      (com.google.protobuf.ExtensionRegistryLite) registry);\n}\n"
    ;
    text_09._M_len = 0xb9;
    io::Printer::Print<>(printer,text_09);
  }
  pFVar9 = this->file_;
  if (0 < pFVar9->enum_type_count_) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      bVar7 = NestedInFileClass((EnumDescriptor *)(&pFVar9->enum_types_->super_SymbolBase + lVar14),
                                this->immutable_api_);
      if (bVar7) {
        pFVar9 = this->file_;
        pGVar5 = (this->generator_factory_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>
                 ._M_head_impl;
        lVar11 = (long)pFVar9->enum_type_count_;
        if (lVar13 < lVar11) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar13,lVar11,"index < enum_type_count()");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
          Generate();
          goto LAB_00e91b7b;
        }
        (*pGVar5->_vptr_GeneratorFactory[3])
                  (&local_e0,pGVar5,&pFVar9->enum_types_->super_SymbolBase + lVar14);
        (**(code **)(*(long *)local_e0.piece_._M_len + 0x10))(local_e0.piece_._M_len,printer);
        if ((long *)local_e0.piece_._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_e0.piece_._M_len + 8))();
        }
      }
      lVar13 = lVar13 + 1;
      pFVar9 = this->file_;
      lVar14 = lVar14 + 0x58;
    } while (lVar13 < pFVar9->enum_type_count_);
  }
  pFVar9 = this->file_;
  if (0 < pFVar9->message_type_count_) {
    lVar13 = 0;
    lVar14 = 0;
    do {
      bVar7 = NestedInFileClass((Descriptor *)(&pFVar9->message_types_->super_SymbolBase + lVar13),
                                this->immutable_api_);
      if (bVar7) {
        _Var4._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
        _M_head_impl = (this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                       super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                       ._M_t;
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                              ._M_head_impl + 0x28))
                  (_Var4._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                   ._M_head_impl,printer);
        _Var4._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
        _M_head_impl = (this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                       super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                       ._M_t;
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                              ._M_head_impl + 0x20))
                  (_Var4._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                   ._M_head_impl,printer);
      }
      lVar14 = lVar14 + 1;
      pFVar9 = this->file_;
      lVar13 = lVar13 + 0xa0;
    } while (lVar14 < pFVar9->message_type_count_);
  }
  if ((((0 < pFVar9->service_count_) &&
       ((((this->context_)._M_t.
          super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
        options_).enforce_lite == false)) &&
      ((pFVar9->options_->field_0)._impl_.java_generic_services_ == true)) &&
     (pFVar9 = this->file_, 0 < pFVar9->service_count_)) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      bVar7 = NestedInFileClass((ServiceDescriptor *)(&pFVar9->services_->super_SymbolBase + lVar14)
                                ,this->immutable_api_);
      if (bVar7) {
        pFVar9 = this->file_;
        pGVar5 = (this->generator_factory_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>
                 ._M_head_impl;
        lVar11 = (long)pFVar9->service_count_;
        if (lVar13 < lVar11) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar13,lVar11,"index < service_count()");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_00e91b7b:
          Generate();
          _Unwind_Resume(extraout_RAX);
        }
        (*pGVar5->_vptr_GeneratorFactory[5])
                  (&local_e0,pGVar5,&pFVar9->services_->super_SymbolBase + lVar14);
        (**(code **)(*(long *)local_e0.piece_._M_len + 0x10))(local_e0.piece_._M_len,printer);
        if ((long *)local_e0.piece_._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_e0.piece_._M_len + 8))();
        }
      }
      lVar13 = lVar13 + 1;
      pFVar9 = this->file_;
      lVar14 = lVar14 + 0x40;
    } while (lVar13 < pFVar9->service_count_);
  }
  if (0 < this->file_->extension_count_) {
    lVar14 = 0;
    do {
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
      _M_head_impl = (this->extension_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                            ._M_head_impl + 0x10))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                 ._M_head_impl,printer);
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->file_->extension_count_);
  }
  local_60[0]._M_len = local_60[0]._M_len & 0xffffffff00000000;
  if (0 < this->file_->message_type_count_) {
    lVar14 = 0;
    do {
      _Var4._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var4._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                            ._M_head_impl + 0x10))
                (_Var4._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                 ._M_head_impl,printer,local_60);
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->file_->message_type_count_);
  }
  text_10._M_str = "\n";
  text_10._M_len = 1;
  io::Printer::Print<>(printer,text_10);
  if ((((this->context_)._M_t.
        super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
      options_).enforce_lite == false) {
    if (this->immutable_api_ == true) {
      GenerateDescriptorInitializationCodeForImmutable(this,printer);
    }
  }
  else {
    text_11._M_str = "static {\n";
    text_11._M_len = 9;
    io::Printer::Print<>(printer,text_11);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    local_e0.piece_._M_len = local_e0.piece_._M_len & 0xffffffff00000000;
    local_100._M_dataplus._M_p = local_100._M_dataplus._M_p & 0xffffffff00000000;
    if (0 < this->file_->message_type_count_) {
      lVar14 = 0;
      do {
        _Var4._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
        _M_head_impl = (this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
                       super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                       ._M_t;
        iVar8 = (**(code **)(*(long *)_Var4._M_t.
                                      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                                      .
                                      super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                                      ._M_head_impl + 0x18))
                          (_Var4._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                           .
                           super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                           ._M_head_impl,printer);
        local_e0.piece_._M_len =
             CONCAT44(local_e0.piece_._M_len._4_4_,(int)local_e0.piece_._M_len + iVar8);
        java::anon_unknown_0::MaybeRestartJavaMethod
                  (printer,(int *)&local_e0,(int *)&local_100,"_clinit_autosplit_$method_num$();\n",
                   "private static void _clinit_autosplit_$method_num$() {\n");
        lVar14 = lVar14 + 1;
      } while (lVar14 < this->file_->message_type_count_);
    }
    io::Printer::Outdent(printer);
    text_12._M_str = "}\n";
    text_12._M_len = 2;
    io::Printer::Print<>(printer,text_12);
  }
  text_13._M_str = "\n// @@protoc_insertion_point(outer_class_scope)\n";
  text_13._M_len = 0x30;
  io::Printer::Print<>(printer,text_13);
  io::Printer::Outdent(printer);
  text_14._M_str = "}\n";
  text_14._M_len = 2;
  io::Printer::Print<>(printer,text_14);
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// NO CHECKED-IN PROTOBUF "
      // Intentional line breaker
      "GENCODE\n"
      "// source: $filename$\n",
      "filename", file_->name());
  if (options_.opensource_runtime) {
    printer->Print("// Protobuf Java Version: $protobuf_java_version$\n",
                   "protobuf_java_version", PROTOBUF_JAVA_VERSION_STRING);
  }
  printer->Print("\n");
  if (!java_package_.empty()) {
    printer->Print(
        "package $package$;\n"
        "\n",
        "package", java_package_);
  }
  PrintGeneratedAnnotation(
      printer, '$',
      options_.annotate_code ? absl::StrCat(classname_, ".java.pb.meta") : "",
      options_);

  if (!options_.opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }
  printer->Print(
      "$deprecation$public final class $classname$ {\n"
      "  private $ctor$() {}\n",
      "deprecation",
      file_->options().deprecated() ? "@java.lang.Deprecated " : "",
      "classname", classname_, "ctor", classname_);
  printer->Annotate("classname", file_->name());
  printer->Indent();

  if (!context_->EnforceLite()) {
    printer->Print("static {\n");
    printer->Indent();
    PrintGencodeVersionValidator(printer, options_.opensource_runtime,
                                 classname_);
    printer->Outdent();
    printer->Print("}\n");
  }

  // -----------------------------------------------------------------

  printer->Print(
      "public static void registerAllExtensions(\n"
      "    com.google.protobuf.ExtensionRegistryLite registry) {\n");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print("}\n");
  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    // Overload registerAllExtensions for the non-lite usage to
    // redundantly maintain the original signature (this is
    // redundant because ExtensionRegistryLite now invokes
    // ExtensionRegistry in the non-lite usage). Intent is
    // to remove this in the future.
    printer->Print(
        "\n"
        "public static void registerAllExtensions(\n"
        "    com.google.protobuf.ExtensionRegistry registry) {\n"
        "  registerAllExtensions(\n"
        "      (com.google.protobuf.ExtensionRegistryLite) registry);\n"
        "}\n");
  }

  // -----------------------------------------------------------------

  for (int i = 0; i < file_->enum_type_count(); i++) {
    if (NestedInFileClass(*file_->enum_type(i), immutable_api_)) {
      generator_factory_->NewEnumGenerator(file_->enum_type(i))
          ->Generate(printer);
    }
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    if (NestedInFileClass(*file_->message_type(i), immutable_api_)) {
      message_generators_[i]->GenerateInterface(printer);
      message_generators_[i]->Generate(printer);
    }
  }
  if (HasGenericServices(file_, context_->EnforceLite())) {
    for (int i = 0; i < file_->service_count(); i++) {
      if (NestedInFileClass(*file_->service(i), immutable_api_)) {
        std::unique_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        generator->Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->Generate(printer);
  }

  // Static variables. We'd like them to be final if possible, but due to
  // the JVM's 64k size limit on static blocks, we have to initialize some
  // of them in methods; thus they cannot be final.
  int static_block_bytecode_estimate = 0;
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariables(
        printer, &static_block_bytecode_estimate);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    if (immutable_api_) {
      GenerateDescriptorInitializationCodeForImmutable(printer);
    }
  } else {
    printer->Print("static {\n");
    printer->Indent();
    int bytecode_estimate = 0;
    int method_num = 0;

    for (int i = 0; i < file_->message_type_count(); i++) {
      bytecode_estimate +=
          message_generators_[i]->GenerateStaticVariableInitializers(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_$method_num$();\n",
          "private static void _clinit_autosplit_$method_num$() {\n");
    }

    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}